

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

void __thiscall
fmt::internal::BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::visit_char
          (BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *this,int value)

{
  wchar_t wVar1;
  Alignment AVar2;
  FormatSpec *pFVar3;
  BasicWriter<wchar_t> *pBVar4;
  undefined8 *puVar5;
  uint uVar6;
  FormatError *this_00;
  ulong uVar7;
  long lVar8;
  wchar_t __tmp;
  int *piVar9;
  int *piVar10;
  ulong uVar11;
  
  pFVar3 = this->spec_;
  if ((pFVar3->type_ == '\0') || (pFVar3->type_ == 'c')) {
    if (((pFVar3->super_AlignSpec).align_ == ALIGN_NUMERIC) || (pFVar3->flags_ != 0)) {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      FormatError::FormatError(this_00,(CStringRef)0x1efc46);
      __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar11 = (ulong)(pFVar3->super_AlignSpec).super_WidthSpec.width_;
    pBVar4 = this->writer_;
    if (uVar11 < 2) {
      puVar5 = *(undefined8 **)(pBVar4 + 8);
      lVar8 = puVar5[2];
      uVar11 = lVar8 + 1;
      if ((ulong)puVar5[3] < uVar11) {
        (**(code **)*puVar5)(puVar5,uVar11);
      }
      puVar5[2] = uVar11;
      piVar9 = (int *)(lVar8 * 4 + *(long *)(*(long *)(pBVar4 + 8) + 8));
    }
    else {
      wVar1 = (pFVar3->super_AlignSpec).super_WidthSpec.fill_;
      puVar5 = *(undefined8 **)(pBVar4 + 8);
      lVar8 = puVar5[2];
      uVar11 = uVar11 + lVar8;
      if ((ulong)puVar5[3] < uVar11) {
        (**(code **)*puVar5)(puVar5);
      }
      puVar5[2] = uVar11;
      piVar10 = (int *)(lVar8 * 4 + *(long *)(*(long *)(pBVar4 + 8) + 8));
      uVar6 = (this->spec_->super_AlignSpec).super_WidthSpec.width_;
      AVar2 = (this->spec_->super_AlignSpec).align_;
      if (AVar2 == ALIGN_CENTER) {
        uVar11 = (ulong)uVar6 - 1;
        uVar7 = uVar11 >> 1;
        if (1 < uVar11) {
          lVar8 = 0;
          do {
            *(wchar_t *)((long)piVar10 + lVar8) = wVar1;
            lVar8 = lVar8 + 4;
          } while (uVar7 * 4 - lVar8 != 0);
        }
        piVar9 = piVar10 + uVar7;
        if (uVar6 != 1) {
          lVar8 = uVar7 * 4 + 4;
          do {
            *(wchar_t *)((long)piVar10 + lVar8) = wVar1;
            lVar8 = lVar8 + 4;
          } while ((ulong)uVar6 << 2 != lVar8);
        }
      }
      else if (AVar2 == ALIGN_RIGHT) {
        uVar6 = uVar6 - 1;
        if (uVar6 != 0) {
          lVar8 = 0;
          do {
            *(wchar_t *)((long)piVar10 + lVar8) = wVar1;
            lVar8 = lVar8 + 4;
          } while ((ulong)uVar6 * 4 - lVar8 != 0);
        }
        piVar9 = piVar10 + uVar6;
      }
      else {
        piVar9 = piVar10;
        if (uVar6 - 1 != 0) {
          lVar8 = 0;
          do {
            *(wchar_t *)((long)piVar10 + lVar8 + 4) = wVar1;
            lVar8 = lVar8 + 4;
          } while ((ulong)(uVar6 - 1) << 2 != lVar8);
        }
      }
    }
    *piVar9 = value;
  }
  else {
    *(byte *)&pFVar3->flags_ = (byte)pFVar3->flags_ | 0x10;
    BasicWriter<wchar_t>::write_int<int,fmt::FormatSpec>(this->writer_,value,*pFVar3);
  }
  return;
}

Assistant:

void visit_char(int value) {
    if (spec_.type_ && spec_.type_ != 'c') {
      spec_.flags_ |= CHAR_FLAG;
      writer_.write_int(value, spec_);
      return;
    }
    if (spec_.align_ == ALIGN_NUMERIC || spec_.flags_ != 0)
      FMT_THROW(FormatError("invalid format specifier for char"));
    typedef typename BasicWriter<Char>::CharPtr CharPtr;
    Char fill = internal::CharTraits<Char>::cast(spec_.fill());
    CharPtr out = CharPtr();
    const unsigned char_width = 1;
    if (spec_.width_ > char_width) {
      out = writer_.grow_buffer(spec_.width_);
      if (spec_.align_ == ALIGN_RIGHT) {
        std::fill_n(out, spec_.width_ - char_width, fill);
        out += spec_.width_ - char_width;
      } else if (spec_.align_ == ALIGN_CENTER) {
        out = writer_.fill_padding(out, spec_.width_,
                                   internal::check(char_width), fill);
      } else {
        std::fill_n(out + char_width, spec_.width_ - char_width, fill);
      }
    } else {
      out = writer_.grow_buffer(char_width);
    }
    *out = internal::CharTraits<Char>::cast(value);
  }